

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void Search::search_finish(search *sch)

{
  long lVar1;
  action_repr *paVar2;
  example *peVar3;
  search_private *psVar4;
  action_repr **ppaVar5;
  example **ppeVar6;
  ostream *this;
  void *this_00;
  long *in_RDI;
  example *ec;
  example *__end2;
  example *__begin2;
  v_array<example> *__range2;
  _func_void_void_ptr *delete_label;
  action_repr *ar;
  action_repr *__end1;
  action_repr *__begin1;
  v_array<Search::action_repr> *__range1;
  size_t i;
  search_private *priv;
  features *in_stack_ffffffffffffff70;
  example *in_stack_ffffffffffffff78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff80;
  search_private *priv_00;
  example *local_50;
  action_repr *local_28;
  search_private *local_18;
  
  lVar1 = *in_RDI;
  clear_cache_hash_map((search_private *)0x12e24f);
  if (*(long **)(lVar1 + 0x280) != (long *)0x0) {
    (**(code **)(**(long **)(lVar1 + 0x280) + 8))();
  }
  if (*(long **)(lVar1 + 0x278) != (long *)0x0) {
    (**(code **)(**(long **)(lVar1 + 0x278) + 8))();
  }
  if (*(long **)(lVar1 + 0x288) != (long *)0x0) {
    (**(code **)(**(long **)(lVar1 + 0x288) + 8))();
  }
  v_hashmap<unsigned_char_*,_Search::scored_action>::~v_hashmap
            ((v_hashmap<unsigned_char_*,_Search::scored_action> *)0x12e2d2);
  std::__cxx11::string::~string((string *)(lVar1 + 0x4f8));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_ffffffffffffff80);
  std::__cxx11::stringstream::~stringstream((stringstream *)(lVar1 + 0x358));
  v_array<int>::delete_v((v_array<int> *)in_stack_ffffffffffffff70);
  v_array<unsigned_long>::delete_v((v_array<unsigned_long> *)in_stack_ffffffffffffff70);
  if ((*(byte *)(lVar1 + 0x68) & 1) == 0) {
    v_array<COST_SENSITIVE::wclass>::delete_v
              ((v_array<COST_SENSITIVE::wclass> *)in_stack_ffffffffffffff70);
  }
  else {
    v_array<CB::cb_class>::delete_v((v_array<CB::cb_class> *)in_stack_ffffffffffffff70);
  }
  if ((*(byte *)(lVar1 + 0x68) & 1) == 0) {
    v_array<COST_SENSITIVE::wclass>::delete_v
              ((v_array<COST_SENSITIVE::wclass> *)in_stack_ffffffffffffff70);
  }
  else {
    v_array<CB::cb_class>::delete_v((v_array<CB::cb_class> *)in_stack_ffffffffffffff70);
  }
  v_array<Search::action_repr>::delete_v((v_array<Search::action_repr> *)in_stack_ffffffffffffff70);
  v_array<unsigned_int>::delete_v((v_array<unsigned_int> *)in_stack_ffffffffffffff70);
  v_array<COST_SENSITIVE::wclass>::delete_v
            ((v_array<COST_SENSITIVE::wclass> *)in_stack_ffffffffffffff70);
  features::delete_v(in_stack_ffffffffffffff70);
  v_array<std::pair<float,_unsigned_long>_>::delete_v
            ((v_array<std::pair<float,_unsigned_long>_> *)in_stack_ffffffffffffff70);
  local_18 = (search_private *)0x0;
  while (priv_00 = local_18,
        psVar4 = (search_private *)
                 v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_>::size
                           ((v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_> *)
                            (lVar1 + 0x5f0)), priv_00 < psVar4) {
    v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_>::operator[]
              ((v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_> *)(lVar1 + 0x5f0),
               (size_t)local_18);
    v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>::delete_v
              ((v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *)in_stack_ffffffffffffff70);
    local_18 = (search_private *)((long)&local_18->all + 1);
  }
  v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_>::delete_v
            ((v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_> *)
             in_stack_ffffffffffffff70);
  if ((*(byte *)(lVar1 + 0x68) & 1) == 0) {
    v_array<COST_SENSITIVE::wclass>::delete_v
              ((v_array<COST_SENSITIVE::wclass> *)in_stack_ffffffffffffff70);
  }
  else {
    v_array<CB::cb_class>::delete_v((v_array<CB::cb_class> *)in_stack_ffffffffffffff70);
  }
  v_array<Search::scored_action>::delete_v
            ((v_array<Search::scored_action> *)in_stack_ffffffffffffff70);
  ppaVar5 = v_array<Search::action_repr>::begin((v_array<Search::action_repr> *)(lVar1 + 0x158));
  local_28 = *ppaVar5;
  ppaVar5 = v_array<Search::action_repr>::end((v_array<Search::action_repr> *)(lVar1 + 0x158));
  paVar2 = *ppaVar5;
  for (; local_28 != paVar2; local_28 = local_28 + 1) {
    if (local_28->repr != (features *)0x0) {
      features::delete_v(in_stack_ffffffffffffff70);
      in_stack_ffffffffffffff78 = (example *)local_28->repr;
      if (in_stack_ffffffffffffff78 != (example *)0x0) {
        operator_delete(in_stack_ffffffffffffff78);
      }
    }
  }
  v_array<Search::action_repr>::delete_v((v_array<Search::action_repr> *)in_stack_ffffffffffffff70);
  clear_memo_foreach_action(priv_00);
  v_array<v_array<Search::action_cache>_*>::delete_v
            ((v_array<v_array<Search::action_cache>_*> *)in_stack_ffffffffffffff70);
  if ((*(byte *)(lVar1 + 0x12) & 1) == 0) {
    in_stack_ffffffffffffff70 = (features *)MULTICLASS::mc_label._32_8_;
    if ((*(byte *)(lVar1 + 0x13) & 1) != 0) {
      in_stack_ffffffffffffff70 = (features *)PTR_delete_label_0048ff58;
    }
    ppeVar6 = v_array<example>::begin((v_array<example> *)(lVar1 + 0xa8));
    local_50 = *ppeVar6;
    ppeVar6 = v_array<example>::end((v_array<example> *)(lVar1 + 0xa8));
    peVar3 = *ppeVar6;
    for (; local_50 != peVar3; local_50 = local_50 + 1) {
      VW::dealloc_example((_func_void_void_ptr *)priv_00,in_stack_ffffffffffffff78,
                          (_func_void_void_ptr *)in_stack_ffffffffffffff70);
    }
    v_array<example>::delete_v((v_array<example> *)in_stack_ffffffffffffff70);
  }
  v_array<char>::delete_v((v_array<char> *)in_stack_ffffffffffffff70);
  v_array<unsigned_int>::delete_v((v_array<unsigned_int> *)in_stack_ffffffffffffff70);
  v_array<Search::action_repr>::delete_v((v_array<Search::action_repr> *)in_stack_ffffffffffffff70);
  if ((*(byte *)(lVar1 + 0x611) & 1) != 0) {
    this = std::operator<<((ostream *)&std::cerr,"search calls to run = ");
    this_00 = (void *)std::ostream::operator<<(this,*(ulong *)(lVar1 + 600));
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  if (*(long *)(*(long *)(lVar1 + 0x648) + 0x18) != 0) {
    (**(code **)(*(long *)(lVar1 + 0x648) + 0x18))(in_RDI);
  }
  if ((*(long *)(lVar1 + 0x650) != 0) && (*(long *)(*(long *)(lVar1 + 0x650) + 0x18) != 0)) {
    (**(code **)(*(long *)(lVar1 + 0x650) + 0x18))(in_RDI);
  }
  free(*(void **)(lVar1 + 0x200));
  if (*(long **)(lVar1 + 0x518) != (long *)0x0) {
    (**(code **)(**(long **)(lVar1 + 0x518) + 8))();
  }
  free((void *)*in_RDI);
  return;
}

Assistant:

void search_finish(search& sch)
{
  search_private& priv = *sch.priv;
  cdbg << "search_finish" << endl;

  clear_cache_hash_map(priv);

  delete priv.truth_string;
  delete priv.pred_string;
  delete priv.bad_string_stream;
  priv.cache_hash_map.~v_hashmap<unsigned char*, scored_action>();
  priv.rawOutputString.~string();
  priv.test_action_sequence.~vector<action>();
  priv.dat_new_feature_audit_ss.~stringstream();
  priv.neighbor_features.delete_v();
  priv.timesteps.delete_v();
  if (priv.cb_learner)
    priv.learn_losses.cb.costs.delete_v();
  else
    priv.learn_losses.cs.costs.delete_v();
  if (priv.cb_learner)
    priv.gte_label.cb.costs.delete_v();
  else
    priv.gte_label.cs.costs.delete_v();

  priv.condition_on_actions.delete_v();
  priv.learn_allowed_actions.delete_v();
  priv.ldf_test_label.costs.delete_v();
  priv.last_action_repr.delete_v();
  priv.active_uncertainty.delete_v();
  for (size_t i = 0; i < priv.active_known.size(); i++) priv.active_known[i].delete_v();
  priv.active_known.delete_v();

  if (priv.cb_learner)
    priv.allowed_actions_cache->cb.costs.delete_v();
  else
    priv.allowed_actions_cache->cs.costs.delete_v();

  priv.train_trajectory.delete_v();
  for (Search::action_repr& ar : priv.ptag_to_action)
  {
    if (ar.repr != nullptr)
    {
      ar.repr->delete_v();
      delete ar.repr;
      cdbg << "delete_v" << endl;
    }
  }
  priv.ptag_to_action.delete_v();
  clear_memo_foreach_action(priv);
  priv.memo_foreach_action.delete_v();

  // destroy copied examples if we needed them
  if (!priv.examples_dont_change)
  {
    void (*delete_label)(void*) = priv.is_ldf ? CS::cs_label.delete_label : MC::mc_label.delete_label;
    for (example& ec : priv.learn_ec_copy) VW::dealloc_example(delete_label, ec);
    priv.learn_ec_copy.delete_v();
  }
  priv.learn_condition_on_names.delete_v();
  priv.learn_condition_on.delete_v();
  priv.learn_condition_on_act.delete_v();

  if (priv.active_csoaa)
    std::cerr << "search calls to run = " << priv.num_calls_to_run << endl;

  if (priv.task->finish)
    priv.task->finish(sch);
  if (priv.metatask && priv.metatask->finish)
    priv.metatask->finish(sch);

  free(priv.allowed_actions_cache);
  delete priv.rawOutputStringStream;
  free(sch.priv);
}